

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O0

Status * __thiscall leveldb::Status::ToString_abi_cxx11_(Status *this)

{
  char **ppcVar1;
  Code CVar2;
  Status *in_RSI;
  allocator local_62;
  undefined1 local_61;
  uint32_t length;
  char *type;
  char tmp [30];
  allocator local_19 [9];
  Status *this_local;
  string *result;
  
  this_local = this;
  if (in_RSI->state_ == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"OK",local_19);
    std::allocator<char>::~allocator((allocator<char> *)local_19);
  }
  else {
    CVar2 = code(in_RSI);
    switch(CVar2) {
    case kOk:
      _length = "OK";
      break;
    case kNotFound:
      _length = "NotFound: ";
      break;
    case kCorruption:
      _length = "Corruption: ";
      break;
    case kNotSupported:
      _length = "Not implemented: ";
      break;
    case kInvalidArgument:
      _length = "Invalid argument: ";
      break;
    case kIOError:
      _length = "IO error: ";
      break;
    default:
      CVar2 = code(in_RSI);
      snprintf((char *)&type,0x1e,"Unknown code(%d): ",(ulong)CVar2);
      _length = (char *)&type;
    }
    ppcVar1 = (char **)_length;
    local_61 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,(char *)ppcVar1,&local_62);
    std::allocator<char>::~allocator((allocator<char> *)&local_62);
    std::__cxx11::string::append((char *)this,(ulong)(in_RSI->state_ + 5));
  }
  return this;
}

Assistant:

std::string Status::ToString() const {
  if (state_ == nullptr) {
    return "OK";
  } else {
    char tmp[30];
    const char* type;
    switch (code()) {
      case kOk:
        type = "OK";
        break;
      case kNotFound:
        type = "NotFound: ";
        break;
      case kCorruption:
        type = "Corruption: ";
        break;
      case kNotSupported:
        type = "Not implemented: ";
        break;
      case kInvalidArgument:
        type = "Invalid argument: ";
        break;
      case kIOError:
        type = "IO error: ";
        break;
      default:
        snprintf(tmp, sizeof(tmp),
                 "Unknown code(%d): ", static_cast<int>(code()));
        type = tmp;
        break;
    }
    std::string result(type);
    uint32_t length;
    memcpy(&length, state_, sizeof(length));
    result.append(state_ + 5, length);
    return result;
  }
}